

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolMap.hpp
# Opt level: O1

void __thiscall PoolMap<String,_TestObject>::~PoolMap(PoolMap<String,_TestObject> *this)

{
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  Item *pIVar3;
  
  if (this->data != (Item **)0x0) {
    operator_delete__(this->data);
  }
  for (pIVar3 = (this->_begin).item; pIVar3 != &this->endItem; pIVar3 = pIVar3->next) {
    String::~String(&pIVar3->key);
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  String::~String(&(this->endItem).key);
  return;
}

Assistant:

~PoolMap()
  {
    delete[] (char*)data;
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }